

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O3

void RigidBodyDynamics::CalcMInvTimesTau
               (Model *model,VectorNd *Q,VectorNd *Tau,VectorNd *QDDot,bool update_kinematics)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  JointType JVar15;
  uint uVar16;
  uint uVar17;
  pointer pSVar18;
  pointer pMVar19;
  pointer pMVar20;
  pointer pMVar21;
  pointer ppCVar22;
  pointer pJVar23;
  pointer pSVar24;
  CustomJoint *pCVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  undefined1 lhs [8];
  ActualDstType actualDst;
  ulong uVar57;
  pointer pSVar58;
  double *pdVar59;
  undefined8 *puVar60;
  CustomJoint *pCVar61;
  long lVar62;
  uint uVar63;
  long lVar64;
  CustomJoint *pCVar65;
  pointer pSVar66;
  SpatialTransform *pSVar67;
  undefined7 in_register_00000081;
  SrcEvaluatorType srcEvaluator;
  ulong uVar68;
  pointer pSVar69;
  byte bVar70;
  double dVar71;
  double dVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  type tmp;
  Vector3d tau_temp;
  SpatialMatrix Ia;
  pointer *local_568;
  vector<RigidBodyDynamics::Body,_std::allocator<RigidBodyDynamics::Body>_> *local_560;
  SpatialTransform local_4e8;
  double local_488;
  double dStack_480;
  double local_478;
  double dStack_470;
  double local_468;
  double dStack_460;
  double local_458;
  double dStack_450;
  double local_448;
  double dStack_440;
  double local_438;
  double dStack_430;
  double local_428;
  double dStack_420;
  double local_418;
  double dStack_410;
  double local_408;
  double dStack_400;
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  double dStack_3e0;
  double local_3d8;
  double dStack_3d0;
  long local_3a0;
  SpatialMatrix local_398;
  undefined1 local_278 [8];
  undefined1 auStack_270 [24];
  double local_258 [32];
  SpatialMatrix local_158;
  
  bVar70 = 0;
  pSVar69 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  *(double *)
   ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = 0.0;
  *(double *)
   ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
  *(double *)
   ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = 0.0;
  *(undefined8 *)
   &(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  pSVar69 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  *(double *)
   ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = 0.0;
  *(double *)
   ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
  *(double *)
   ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = 0.0;
  *(undefined8 *)
   &(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  if ((int)CONCAT71(in_register_00000081,update_kinematics) == 0) {
    uVar57 = ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
LAB_00175459:
    if (1 < uVar57) {
      pSVar69 = (model->pA).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar68 = 1;
      uVar63 = 2;
      do {
        pdVar59 = (double *)
                  ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar59 = 0.0;
        pdVar59[1] = 0.0;
        pdVar59 = (double *)
                  ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar59 = 0.0;
        pdVar59[1] = 0.0;
        *(undefined8 *)
         &pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
        *(double *)
         ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
        uVar68 = (ulong)uVar63;
        uVar63 = uVar63 + 1;
      } while (uVar68 < uVar57);
    }
    if (!update_kinematics) goto LAB_00176b5f;
  }
  else {
    uVar57 = ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    if (1 < uVar57) {
      uVar68 = 1;
      uVar63 = 2;
      do {
        jcalc_X_lambda_S(model,(model->mJointUpdateOrder).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar68],Q);
        pSVar69 = (model->v_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar59 = (double *)
                  ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar59 = 0.0;
        pdVar59[1] = 0.0;
        pdVar59 = (double *)
                  ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar59 = 0.0;
        pdVar59[1] = 0.0;
        *(undefined8 *)
         &pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
        *(double *)
         ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
        pSVar69 = (model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar59 = (double *)
                  ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar59 = 0.0;
        pdVar59[1] = 0.0;
        pdVar59 = (double *)
                  ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar59 = 0.0;
        pdVar59[1] = 0.0;
        *(undefined8 *)
         &pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
        *(double *)
         ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
        pSVar69 = (model->c).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar59 = (double *)
                  ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar59 = 0.0;
        pdVar59[1] = 0.0;
        pdVar59 = (double *)
                  ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar59 = 0.0;
        pdVar59[1] = 0.0;
        *(undefined8 *)
         &pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
        *(double *)
         ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
        pSVar69 = (model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar59 = (double *)
                  ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar59 = 0.0;
        pdVar59[1] = 0.0;
        pdVar59 = (double *)
                  ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar59 = 0.0;
        pdVar59[1] = 0.0;
        *(undefined8 *)
         &pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
        *(double *)
         ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
        Math::SpatialRigidBodyInertia::setSpatialMatrix
                  ((model->I).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar68,
                   (model->IA).
                   super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                   super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar68);
        uVar68 = (ulong)uVar63;
        uVar57 = ((long)(model->mBodies).
                        super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                        .
                        super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(model->mBodies).
                        super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                        .
                        super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
        uVar63 = uVar63 + 1;
      } while (uVar68 <= uVar57 && uVar57 - uVar68 != 0);
      goto LAB_00175459;
    }
  }
  local_560 = &model->mBodies;
  local_568 = &(model->mBodies).
               super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
               .
               super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  uVar63 = (int)uVar57 - 1;
  if (uVar63 != 0) {
    uVar57 = (ulong)uVar63;
    local_3a0 = uVar57 * 0x90 + 0x28;
    do {
      lVar62 = local_3a0;
      pJVar23 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      JVar15 = pJVar23[uVar57].mJointType;
      if (pJVar23[uVar57].mDoFCount == 3) {
        if (JVar15 == JointTypeCustom) goto LAB_00176415;
        pMVar19 = (model->multdof3_U).
                  super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  .
                  super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar18 = (model->IA).
                  super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                  super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar20 = (model->multdof3_S).
                  super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  .
                  super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        dVar37 = *(double *)
                  &pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>;
        dVar38 = *(double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 8);
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x10);
        dVar39 = *pdVar59;
        dVar40 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x20);
        dVar41 = *pdVar59;
        dVar42 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x30);
        dVar43 = *pdVar59;
        dVar44 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x60);
        dVar45 = *pdVar59;
        dVar46 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x90);
        dVar47 = *pdVar59;
        dVar48 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xc0);
        dVar49 = *pdVar59;
        dVar50 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xf0);
        dVar51 = *pdVar59;
        dVar52 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x40);
        dVar53 = *pdVar59;
        dVar54 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x70);
        dVar55 = *pdVar59;
        dVar56 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xa0);
        dVar71 = *pdVar59;
        dVar13 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xd0);
        dVar72 = *pdVar59;
        dVar10 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x100);
        dVar11 = *pdVar59;
        dVar12 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x50);
        dVar14 = *pdVar59;
        dVar28 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x80);
        dVar29 = *pdVar59;
        dVar30 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xb0);
        dVar31 = *pdVar59;
        dVar32 = pdVar59[1];
        lVar64 = 0;
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0xe0);
        dVar33 = *pdVar59;
        dVar34 = pdVar59[1];
        pdVar59 = (double *)
                  ((long)&pSVar18[uVar57].super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + 0x110);
        dVar35 = *pdVar59;
        dVar36 = pdVar59[1];
        do {
          dVar4 = *(double *)
                   ((long)&(pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar64 + lVar62 + -0x28);
          dVar5 = *(double *)
                   ((long)&(pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar64 + lVar62 + -0x20);
          dVar6 = *(double *)
                   ((long)&(pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar64 + lVar62 + -0x18);
          dVar7 = *(double *)
                   ((long)&(pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar64 + lVar62 + -0x10);
          dVar8 = *(double *)
                   ((long)&(pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar64 + lVar62 + -8);
          dVar9 = *(double *)
                   ((long)&(pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                           m_storage + lVar64 + lVar62);
          *(double *)
           ((long)local_4e8.E.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + lVar64) =
               dVar51 * dVar9 +
               dVar49 * dVar8 + dVar47 * dVar7 + dVar45 * dVar6 + dVar43 * dVar5 + dVar37 * dVar4;
          *(double *)
           ((long)&local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data +
           lVar64 + 8) = dVar52 * dVar9 +
                         dVar50 * dVar8 +
                         dVar48 * dVar7 + dVar46 * dVar6 + dVar44 * dVar5 + dVar38 * dVar4;
          *(double *)
           ((long)&local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data +
           lVar64 + 0x10) =
               dVar11 * dVar9 +
               dVar72 * dVar8 + dVar71 * dVar7 + dVar55 * dVar6 + dVar53 * dVar5 + dVar39 * dVar4;
          *(double *)
           ((long)&local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data +
           lVar64 + 0x18) =
               dVar12 * dVar9 +
               dVar10 * dVar8 + dVar13 * dVar7 + dVar56 * dVar6 + dVar54 * dVar5 + dVar40 * dVar4;
          *(double *)
           ((long)&local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data +
           lVar64 + 0x20) =
               dVar9 * dVar35 +
               dVar8 * dVar33 + dVar7 * dVar31 + dVar6 * dVar29 + dVar5 * dVar14 + dVar4 * dVar41;
          *(double *)
           ((long)&local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data +
           lVar64 + 0x28) =
               dVar9 * dVar36 +
               dVar8 * dVar34 + dVar7 * dVar32 + dVar6 * dVar30 + dVar5 * dVar28 + dVar4 * dVar42;
          lVar64 = lVar64 + 0x30;
        } while (lVar64 != 0x90);
        *(double *)
         &pMVar19[uVar57].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
             local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[0];
        *(double *)
         ((long)&pMVar19[uVar57].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                 m_storage + 8) =
             local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[1];
        pdVar59 = (double *)
                  ((long)&pMVar19[uVar57].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x10);
        *pdVar59 = local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[2];
        pdVar59[1] = local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[3];
        pdVar59 = (double *)
                  ((long)&pMVar19[uVar57].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x20);
        *pdVar59 = local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[4];
        pdVar59[1] = local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[5];
        pdVar59 = (double *)
                  ((long)&pMVar19[uVar57].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x30);
        *pdVar59 = local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[6];
        pdVar59[1] = local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[7];
        pdVar59 = (double *)
                  ((long)&pMVar19[uVar57].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x40);
        *pdVar59 = local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[8];
        pdVar59[1] = local_4e8.r.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0];
        pdVar59 = (double *)
                  ((long)&pMVar19[uVar57].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x50);
        *pdVar59 = local_4e8.r.super_Vector3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1];
        pdVar59[1] = local_4e8.r.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[2];
        pdVar59 = (double *)
                  ((long)&pMVar19[uVar57].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x60);
        *pdVar59 = local_488;
        pdVar59[1] = dStack_480;
        pdVar59 = (double *)
                  ((long)&pMVar19[uVar57].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x70);
        *pdVar59 = local_478;
        pdVar59[1] = dStack_470;
        pdVar59 = (double *)
                  ((long)&pMVar19[uVar57].
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                  0x80);
        *pdVar59 = local_468;
        pdVar59[1] = dStack_460;
        local_278 = (undefined1  [8])
                    ((model->multdof3_S).
                     super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                     .
                     super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar57);
        auStack_270._0_8_ =
             (model->multdof3_U).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar57;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<double,_3,_3,_0,_3,_3> *)&local_4e8,(SrcXprType *)local_278,
              (assign_op<double,_double> *)&local_398);
        pMVar21 = (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        *(double *)
         &pMVar21[uVar57].super_Matrix3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage =
             local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[0];
        *(double *)
         ((long)&pMVar21[uVar57].super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage + 8) =
             local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[1];
        pdVar59 = (double *)
                  ((long)&pMVar21[uVar57].super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                  0x10);
        *pdVar59 = local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[2];
        pdVar59[1] = local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[3];
        pdVar59 = (double *)
                  ((long)&pMVar21[uVar57].super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                  0x20);
        *pdVar59 = local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[4];
        pdVar59[1] = local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[5];
        pdVar59 = (double *)
                  ((long)&pMVar21[uVar57].super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                  0x30);
        *pdVar59 = local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[6];
        pdVar59[1] = local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[7];
        *(double *)
         ((long)&pMVar21[uVar57].super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage + 0x40) =
             local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
             .m_storage.m_data.array[8];
        uVar68 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar57];
        if (uVar68 != 0) {
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[0] =
               (double)((model->IA).
                        super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                        super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar57);
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[1] =
               (double)((model->multdof3_U).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar57);
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[2] =
               (double)((model->multdof3_Dinv).
                        super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar57);
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[3] =
               local_4e8.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [1];
          SpatialMatrix_t::
          SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>const>>
                    ((SpatialMatrix_t *)local_278,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                      *)&local_4e8);
          Math::SpatialTransform::toMatrixTranspose
                    (&local_398,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar57);
          Math::SpatialTransform::toMatrix
                    (&local_158,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar57);
          dVar56 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x23];
          dVar55 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x22];
          dVar54 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x21];
          dVar53 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x20];
          dVar52 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1f];
          dVar51 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1e];
          dVar50 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1d];
          dVar49 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1c];
          dVar48 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1b];
          dVar47 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1a];
          dVar46 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x19];
          dVar45 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x18];
          dVar44 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x17];
          dVar43 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x16];
          dVar42 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x15];
          dVar41 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x14];
          dVar40 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x13];
          dVar39 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x12];
          dVar38 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x11];
          dVar37 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x10];
          dVar36 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xf];
          dVar35 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xe];
          dVar34 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xd];
          dVar33 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xc];
          dVar32 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xb];
          dVar31 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[10];
          dVar30 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[9];
          dVar29 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[8];
          dVar28 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[7];
          dVar14 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[6];
          dVar12 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[5];
          dVar11 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[4];
          dVar10 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[3];
          dVar72 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[2];
          dVar13 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[1];
          dVar71 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0];
          pSVar18 = (model->IA).
                    super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar62 = 0;
          do {
            dVar4 = *(double *)(local_278 + lVar62);
            dVar5 = *(double *)(auStack_270 + lVar62);
            dVar6 = *(double *)(auStack_270 + lVar62 + 8);
            dVar7 = *(double *)(auStack_270 + lVar62 + 0x10);
            dVar8 = *(double *)((long)local_258 + lVar62);
            dVar9 = *(double *)((long)local_258 + lVar62 + 8);
            *(double *)
             ((long)local_4e8.E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar62) =
                 dVar51 * dVar9 +
                 dVar45 * dVar8 + dVar39 * dVar7 + dVar33 * dVar6 + dVar14 * dVar5 + dVar71 * dVar4;
            *(double *)
             ((long)&local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             lVar62 + 8) = dVar52 * dVar9 +
                           dVar46 * dVar8 +
                           dVar40 * dVar7 + dVar34 * dVar6 + dVar28 * dVar5 + dVar13 * dVar4;
            *(double *)
             ((long)&local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             lVar62 + 0x10) =
                 dVar53 * dVar9 +
                 dVar47 * dVar8 + dVar41 * dVar7 + dVar35 * dVar6 + dVar29 * dVar5 + dVar72 * dVar4;
            *(double *)
             ((long)&local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             lVar62 + 0x18) =
                 dVar54 * dVar9 +
                 dVar48 * dVar8 + dVar42 * dVar7 + dVar36 * dVar6 + dVar30 * dVar5 + dVar10 * dVar4;
            *(double *)
             ((long)&local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             lVar62 + 0x20) =
                 dVar9 * dVar55 +
                 dVar8 * dVar49 + dVar7 * dVar43 + dVar6 * dVar37 + dVar5 * dVar31 + dVar4 * dVar11;
            *(double *)
             ((long)&local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             lVar62 + 0x28) =
                 dVar9 * dVar56 +
                 dVar8 * dVar50 + dVar7 * dVar44 + dVar6 * dVar38 + dVar5 * dVar32 + dVar4 * dVar12;
            lVar62 = lVar62 + 0x30;
          } while (lVar62 != 0x120);
          lVar62 = 0;
          do {
            dVar71 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62);
            dVar13 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 8);
            dVar72 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x10);
            dVar10 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x18);
            dVar11 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x20);
            dVar12 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x28);
            pdVar59 = (double *)
                      ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar62)
            ;
            dVar14 = pdVar59[1];
            pdVar1 = (double *)
                     ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar62);
            *pdVar1 = dVar12 * local_3f8 +
                      dVar11 * local_428 +
                      dVar10 * local_458 +
                      dVar72 * local_488 +
                      dVar13 * local_4e8.E.super_Matrix3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[6] +
                      dVar71 * local_4e8.E.super_Matrix3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[0] + *pdVar59;
            pdVar1[1] = dVar12 * dStack_3f0 +
                        dVar11 * dStack_420 +
                        dVar10 * dStack_450 +
                        dVar72 * dStack_480 +
                        dVar13 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[7] +
                        dVar71 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[1] + dVar14;
            dVar71 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62);
            dVar13 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 8);
            dVar72 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x10);
            dVar10 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x18);
            dVar11 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x20);
            dVar12 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x28);
            pdVar59 = (double *)
                      ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                      lVar62 + 0x10);
            dVar14 = pdVar59[1];
            pdVar1 = (double *)
                     ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     lVar62 + 0x10);
            *pdVar1 = dVar12 * local_3e8 +
                      dVar11 * local_418 +
                      dVar10 * local_448 +
                      dVar72 * local_478 +
                      dVar13 * local_4e8.E.super_Matrix3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[8] +
                      dVar71 * local_4e8.E.super_Matrix3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[2] + *pdVar59;
            pdVar1[1] = dVar12 * dStack_3e0 +
                        dVar11 * dStack_410 +
                        dVar10 * dStack_440 +
                        dVar72 * dStack_470 +
                        dVar13 * local_4e8.r.super_Vector3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] +
                        dVar71 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[3] + dVar14;
            dVar71 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62);
            dVar13 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 8);
            dVar72 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x10);
            dVar10 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x18);
            dVar11 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x20);
            dVar12 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar62 + 0x28);
            pdVar59 = (double *)
                      ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                      lVar62 + 0x20);
            dVar14 = pdVar59[1];
            pdVar1 = (double *)
                     ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     lVar62 + 0x20);
            *pdVar1 = dVar12 * local_3d8 +
                      dVar11 * local_408 +
                      dVar10 * local_438 +
                      dVar72 * local_468 +
                      dVar13 * local_4e8.r.super_Vector3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[1] +
                      dVar71 * local_4e8.E.super_Matrix3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[4] + *pdVar59;
            pdVar1[1] = dVar12 * dStack_3d0 +
                        dVar11 * dStack_400 +
                        dVar10 * dStack_430 +
                        dVar72 * dStack_460 +
                        dVar13 * local_4e8.r.super_Vector3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2] +
                        dVar71 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[5] + dVar14;
            lVar62 = lVar62 + 0x30;
          } while (lVar62 != 0x120);
        }
      }
      else if (pJVar23[uVar57].mDoFCount == 1) {
        if (JVar15 == JointTypeCustom) {
LAB_00176415:
          uVar63 = pJVar23[uVar57].custom_joint_index;
          ppCVar22 = (model->mCustomJoints).
                     super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[0] =
               (double)((model->IA).
                        super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                        super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar57);
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[1] = (double)(ppCVar22[uVar63] + 0x70);
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)(ppCVar22[uVar63] + 0x88),
                     (Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                      *)&local_4e8,(assign_op<double,_double> *)local_278,(type)0x0);
          auStack_270._0_8_ =
               (model->mCustomJoints).
               super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar63];
          local_278 = (undefined1  [8])(auStack_270._0_8_ + 0x70);
          auStack_270._0_8_ = auStack_270._0_8_ + 0x88;
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[0] = 0.0;
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[1] = 0.0;
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[2] = 0.0;
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_4e8,(SrcXprType *)local_278,
                (assign_op<double,_double> *)&local_398);
          dVar71 = local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[0];
          pCVar25 = (model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar63];
          if ((*(CustomJoint **)(pCVar25 + 0xa8) !=
               (CustomJoint *)
               local_4e8.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [1]) || (pCVar61 = (CustomJoint *)
                                  local_4e8.E.super_Matrix3d.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[2],
                       pCVar65 = (CustomJoint *)
                                 local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[1],
                       *(CustomJoint **)(pCVar25 + 0xb0) !=
                       (CustomJoint *)
                       local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[2])) {
            if (((CustomJoint *)
                 local_4e8.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [2] != (CustomJoint *)0x0 &&
                 (CustomJoint *)
                 local_4e8.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [1] != (CustomJoint *)0x0) &&
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                       SEXT816((long)local_4e8.E.super_Matrix3d.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[2]),0) <
                (long)local_4e8.E.super_Matrix3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array[1])) {
              puVar60 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar60 = operator_new;
              __cxa_throw(puVar60,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                      ((DenseStorage<double,__1,__1,__1,_0> *)(pCVar25 + 0xa0),
                       (long)local_4e8.E.super_Matrix3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array[2] *
                       (long)local_4e8.E.super_Matrix3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array[1],
                       (Index)local_4e8.E.super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[1],
                       (Index)local_4e8.E.super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[2]);
            pCVar65 = *(CustomJoint **)(pCVar25 + 0xa8);
            pCVar61 = *(CustomJoint **)(pCVar25 + 0xb0);
          }
          lVar62 = (long)pCVar61 * (long)pCVar65;
          pdVar59 = ((DenseStorage<double,__1,__1,__1,_0> *)(pCVar25 + 0xa0))->m_data;
          uVar68 = lVar62 - (lVar62 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < lVar62) {
            lVar64 = 0;
            do {
              pdVar1 = (((Matrix<double,_6,_6,_0,_6,_6> *)dVar71)->
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                       m_data.array + lVar64;
              dVar13 = pdVar1[1];
              pdVar2 = pdVar59 + lVar64;
              *pdVar2 = *pdVar1;
              pdVar2[1] = dVar13;
              lVar64 = lVar64 + 2;
            } while (lVar64 < (long)uVar68);
          }
          if ((long)uVar68 < lVar62) {
            do {
              pdVar59[uVar68] =
                   (((Matrix<double,_6,_6,_0,_6,_6> *)dVar71)->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.m_data.
                   array[uVar68];
              uVar68 = uVar68 + 1;
            } while (lVar62 - uVar68 != 0);
          }
          free((void *)local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[0]);
          uVar68 = (ulong)(model->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar57];
          if (uVar68 != 0) {
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[0] =
                 (double)((model->IA).
                          super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                          super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar57);
            pCVar25 = (model->mCustomJoints).
                      super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar63];
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[1] = (double)(pCVar25 + 0x88);
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[2] = (double)(pCVar25 + 0xa0);
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[3] =
                 local_4e8.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [1];
            SpatialMatrix_t::
            SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>>
                      ((SpatialMatrix_t *)local_278,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>_>
                        *)&local_4e8);
            Math::SpatialTransform::toMatrixTranspose
                      (&local_398,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar57);
            Math::SpatialTransform::toMatrix
                      (&local_158,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar57);
            dVar56 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x23];
            dVar55 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x22];
            dVar54 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x21];
            dVar53 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x20];
            dVar52 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1f];
            dVar51 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1e];
            dVar50 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1d];
            dVar49 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1c];
            dVar48 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1b];
            dVar47 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1a];
            dVar46 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x19];
            dVar45 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x18];
            dVar44 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x17];
            dVar43 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x16];
            dVar42 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x15];
            dVar41 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x14];
            dVar40 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x13];
            dVar39 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x12];
            dVar38 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x11];
            dVar37 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x10];
            dVar36 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xf];
            dVar35 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xe];
            dVar34 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xd];
            dVar33 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xc];
            dVar32 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xb];
            dVar31 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[10];
            dVar30 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[9];
            dVar29 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[8];
            dVar28 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[7];
            dVar14 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[6];
            dVar12 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[5];
            dVar11 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[4];
            dVar10 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[3];
            dVar72 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[2];
            dVar13 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[1];
            dVar71 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0];
            pSVar18 = (model->IA).
                      super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                      super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar62 = 0;
            do {
              dVar4 = *(double *)(local_278 + lVar62);
              dVar5 = *(double *)(auStack_270 + lVar62);
              dVar6 = *(double *)(auStack_270 + lVar62 + 8);
              dVar7 = *(double *)(auStack_270 + lVar62 + 0x10);
              dVar8 = *(double *)((long)local_258 + lVar62);
              dVar9 = *(double *)((long)local_258 + lVar62 + 8);
              *(double *)
               ((long)local_4e8.E.super_Matrix3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array + lVar62) =
                   dVar51 * dVar9 +
                   dVar45 * dVar8 +
                   dVar39 * dVar7 + dVar33 * dVar6 + dVar14 * dVar5 + dVar71 * dVar4;
              *(double *)
               ((long)&local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + lVar62 + 8) =
                   dVar52 * dVar9 +
                   dVar46 * dVar8 +
                   dVar40 * dVar7 + dVar34 * dVar6 + dVar28 * dVar5 + dVar13 * dVar4;
              *(double *)
               ((long)&local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + lVar62 + 0x10) =
                   dVar53 * dVar9 +
                   dVar47 * dVar8 +
                   dVar41 * dVar7 + dVar35 * dVar6 + dVar29 * dVar5 + dVar72 * dVar4;
              *(double *)
               ((long)&local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + lVar62 + 0x18) =
                   dVar54 * dVar9 +
                   dVar48 * dVar8 +
                   dVar42 * dVar7 + dVar36 * dVar6 + dVar30 * dVar5 + dVar10 * dVar4;
              *(double *)
               ((long)&local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + lVar62 + 0x20) =
                   dVar9 * dVar55 +
                   dVar8 * dVar49 +
                   dVar7 * dVar43 + dVar6 * dVar37 + dVar5 * dVar31 + dVar4 * dVar11;
              *(double *)
               ((long)&local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + lVar62 + 0x28) =
                   dVar9 * dVar56 +
                   dVar8 * dVar50 +
                   dVar7 * dVar44 + dVar6 * dVar38 + dVar5 * dVar32 + dVar4 * dVar12;
              lVar62 = lVar62 + 0x30;
            } while (lVar62 != 0x120);
            lVar62 = 0;
            do {
              dVar71 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62);
              dVar13 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 8);
              dVar72 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x10);
              dVar10 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x18);
              dVar11 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x20);
              dVar12 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x28);
              pdVar59 = (double *)
                        ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar62);
              dVar14 = pdVar59[1];
              pdVar1 = (double *)
                       ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar62
                       );
              *pdVar1 = dVar12 * local_3f8 +
                        dVar11 * local_428 +
                        dVar10 * local_458 +
                        dVar72 * local_488 +
                        dVar13 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[6] +
                        dVar71 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[0] + *pdVar59;
              pdVar1[1] = dVar12 * dStack_3f0 +
                          dVar11 * dStack_420 +
                          dVar10 * dStack_450 +
                          dVar72 * dStack_480 +
                          dVar13 * local_4e8.E.super_Matrix3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[7] +
                          dVar71 * local_4e8.E.super_Matrix3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[1] + dVar14;
              dVar71 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62);
              dVar13 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 8);
              dVar72 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x10);
              dVar10 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x18);
              dVar11 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x20);
              dVar12 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x28);
              pdVar59 = (double *)
                        ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar62 + 0x10);
              dVar14 = pdVar59[1];
              pdVar1 = (double *)
                       ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                       lVar62 + 0x10);
              *pdVar1 = dVar12 * local_3e8 +
                        dVar11 * local_418 +
                        dVar10 * local_448 +
                        dVar72 * local_478 +
                        dVar13 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[8] +
                        dVar71 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[2] + *pdVar59;
              pdVar1[1] = dVar12 * dStack_3e0 +
                          dVar11 * dStack_410 +
                          dVar10 * dStack_440 +
                          dVar72 * dStack_470 +
                          dVar13 * local_4e8.r.super_Vector3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[0] +
                          dVar71 * local_4e8.E.super_Matrix3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[3] + dVar14;
              dVar71 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62);
              dVar13 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 8);
              dVar72 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x10);
              dVar10 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x18);
              dVar11 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x20);
              dVar12 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x28);
              pdVar59 = (double *)
                        ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar62 + 0x20);
              dVar14 = pdVar59[1];
              pdVar1 = (double *)
                       ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                       lVar62 + 0x20);
              *pdVar1 = dVar12 * local_3d8 +
                        dVar11 * local_408 +
                        dVar10 * local_438 +
                        dVar72 * local_468 +
                        dVar13 * local_4e8.r.super_Vector3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] +
                        dVar71 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[4] + *pdVar59;
              pdVar1[1] = dVar12 * dStack_3d0 +
                          dVar11 * dStack_400 +
                          dVar10 * dStack_430 +
                          dVar72 * dStack_460 +
                          dVar13 * local_4e8.r.super_Vector3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[2] +
                          dVar71 * local_4e8.E.super_Matrix3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[5] + dVar14;
              lVar62 = lVar62 + 0x30;
            } while (lVar62 != 0x120);
          }
        }
        else {
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[0] =
               (double)((model->IA).
                        super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                        super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar57);
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[1] =
               (double)((model->S).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar57);
          SpatialVector_t::operator=
                    ((model->U).
                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar57,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                      *)&local_4e8);
          pSVar69 = (model->S).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar58 = (model->U).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar59 = (double *)
                    ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          pdVar1 = (double *)
                   ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          pdVar2 = (double *)
                   ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          pdVar3 = (double *)
                   ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar71 = pdVar1[1] * pdVar3[1] + pdVar59[1] * pdVar2[1] +
                   *(double *)
                    ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                   *(double *)
                    ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                   *pdVar1 * *pdVar3 + *pdVar59 * *pdVar2 +
                   *(double *)
                    &pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                   *(double *)
                    &pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar57] = dVar71;
          uVar68 = (ulong)(model->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar57];
          if (uVar68 != 0) {
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[1] = (double)(pSVar58 + uVar57);
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[0] =
                 (double)((model->IA).
                          super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                          super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar57);
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[2] =
                 local_4e8.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [1];
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[4] = dVar71;
            SpatialMatrix_t::
            SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>,0>const>>
                      ((SpatialMatrix_t *)local_278,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>_>
                        *)&local_4e8);
            Math::SpatialTransform::toMatrixTranspose
                      (&local_398,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar57);
            Math::SpatialTransform::toMatrix
                      (&local_158,
                       (model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar57);
            dVar56 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x23];
            dVar55 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x22];
            dVar54 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x21];
            dVar53 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x20];
            dVar52 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1f];
            dVar51 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1e];
            dVar50 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1d];
            dVar49 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1c];
            dVar48 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1b];
            dVar47 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x1a];
            dVar46 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x19];
            dVar45 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x18];
            dVar44 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x17];
            dVar43 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x16];
            dVar42 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x15];
            dVar41 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x14];
            dVar40 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x13];
            dVar39 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x12];
            dVar38 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x11];
            dVar37 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0x10];
            dVar36 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xf];
            dVar35 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xe];
            dVar34 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xd];
            dVar33 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xc];
            dVar32 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0xb];
            dVar31 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[10];
            dVar30 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[9];
            dVar29 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[8];
            dVar28 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[7];
            dVar14 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[6];
            dVar12 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[5];
            dVar11 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[4];
            dVar10 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[3];
            dVar72 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[2];
            dVar13 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[1];
            dVar71 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[0];
            pSVar18 = (model->IA).
                      super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                      super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar62 = 0;
            do {
              dVar4 = *(double *)(local_278 + lVar62);
              dVar5 = *(double *)(auStack_270 + lVar62);
              dVar6 = *(double *)(auStack_270 + lVar62 + 8);
              dVar7 = *(double *)(auStack_270 + lVar62 + 0x10);
              dVar8 = *(double *)((long)local_258 + lVar62);
              dVar9 = *(double *)((long)local_258 + lVar62 + 8);
              *(double *)
               ((long)local_4e8.E.super_Matrix3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array + lVar62) =
                   dVar51 * dVar9 +
                   dVar45 * dVar8 +
                   dVar39 * dVar7 + dVar33 * dVar6 + dVar14 * dVar5 + dVar71 * dVar4;
              *(double *)
               ((long)&local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + lVar62 + 8) =
                   dVar52 * dVar9 +
                   dVar46 * dVar8 +
                   dVar40 * dVar7 + dVar34 * dVar6 + dVar28 * dVar5 + dVar13 * dVar4;
              *(double *)
               ((long)&local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + lVar62 + 0x10) =
                   dVar53 * dVar9 +
                   dVar47 * dVar8 +
                   dVar41 * dVar7 + dVar35 * dVar6 + dVar29 * dVar5 + dVar72 * dVar4;
              *(double *)
               ((long)&local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + lVar62 + 0x18) =
                   dVar54 * dVar9 +
                   dVar48 * dVar8 +
                   dVar42 * dVar7 + dVar36 * dVar6 + dVar30 * dVar5 + dVar10 * dVar4;
              *(double *)
               ((long)&local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + lVar62 + 0x20) =
                   dVar9 * dVar55 +
                   dVar8 * dVar49 +
                   dVar7 * dVar43 + dVar6 * dVar37 + dVar5 * dVar31 + dVar4 * dVar11;
              *(double *)
               ((long)&local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + lVar62 + 0x28) =
                   dVar9 * dVar56 +
                   dVar8 * dVar50 +
                   dVar7 * dVar44 + dVar6 * dVar38 + dVar5 * dVar32 + dVar4 * dVar12;
              lVar62 = lVar62 + 0x30;
            } while (lVar62 != 0x120);
            lVar62 = 0;
            do {
              dVar71 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62);
              dVar13 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 8);
              dVar72 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x10);
              dVar10 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x18);
              dVar11 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x20);
              dVar12 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x28);
              pdVar59 = (double *)
                        ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar62);
              dVar14 = pdVar59[1];
              pdVar1 = (double *)
                       ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar62
                       );
              *pdVar1 = dVar12 * local_3f8 +
                        dVar11 * local_428 +
                        dVar10 * local_458 +
                        dVar72 * local_488 +
                        dVar13 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[6] +
                        dVar71 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[0] + *pdVar59;
              pdVar1[1] = dVar12 * dStack_3f0 +
                          dVar11 * dStack_420 +
                          dVar10 * dStack_450 +
                          dVar72 * dStack_480 +
                          dVar13 * local_4e8.E.super_Matrix3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[7] +
                          dVar71 * local_4e8.E.super_Matrix3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[1] + dVar14;
              dVar71 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62);
              dVar13 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 8);
              dVar72 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x10);
              dVar10 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x18);
              dVar11 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x20);
              dVar12 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x28);
              pdVar59 = (double *)
                        ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar62 + 0x10);
              dVar14 = pdVar59[1];
              pdVar1 = (double *)
                       ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                       lVar62 + 0x10);
              *pdVar1 = dVar12 * local_3e8 +
                        dVar11 * local_418 +
                        dVar10 * local_448 +
                        dVar72 * local_478 +
                        dVar13 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[8] +
                        dVar71 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[2] + *pdVar59;
              pdVar1[1] = dVar12 * dStack_3e0 +
                          dVar11 * dStack_410 +
                          dVar10 * dStack_440 +
                          dVar72 * dStack_470 +
                          dVar13 * local_4e8.r.super_Vector3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[0] +
                          dVar71 * local_4e8.E.super_Matrix3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[3] + dVar14;
              dVar71 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62);
              dVar13 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 8);
              dVar72 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x10);
              dVar10 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x18);
              dVar11 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x20);
              dVar12 = *(double *)
                        ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array + lVar62 + 0x28);
              pdVar59 = (double *)
                        ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                        lVar62 + 0x20);
              dVar14 = pdVar59[1];
              pdVar1 = (double *)
                       ((long)&pSVar18[uVar68].super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                       lVar62 + 0x20);
              *pdVar1 = dVar12 * local_3d8 +
                        dVar11 * local_408 +
                        dVar10 * local_438 +
                        dVar72 * local_468 +
                        dVar13 * local_4e8.r.super_Vector3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] +
                        dVar71 * local_4e8.E.super_Matrix3d.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[4] + *pdVar59;
              pdVar1[1] = dVar12 * dStack_3d0 +
                          dVar11 * dStack_400 +
                          dVar10 * dStack_430 +
                          dVar72 * dStack_460 +
                          dVar13 * local_4e8.r.super_Vector3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[2] +
                          dVar71 * local_4e8.E.super_Matrix3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[5] + dVar14;
              lVar62 = lVar62 + 0x30;
            } while (lVar62 != 0x120);
          }
        }
      }
      else if (JVar15 == JointTypeCustom) goto LAB_00176415;
      uVar57 = uVar57 - 1;
      local_3a0 = local_3a0 + -0x90;
    } while ((int)uVar57 != 0);
    uVar57 = ((long)*local_568 -
              (long)(local_560->
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ).
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  }
LAB_00176b5f:
  local_560 = &model->mBodies;
  local_568 = &(model->mBodies).
               super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
               .
               super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  uVar63 = (int)uVar57 - 1;
  if (uVar63 != 0) {
    uVar57 = (ulong)uVar63;
    do {
      pJVar23 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar63 = pJVar23[uVar57].q_index;
      JVar15 = pJVar23[uVar57].mJointType;
      if (pJVar23[uVar57].mDoFCount == 3) {
        if (JVar15 == JointTypeCustom) goto LAB_00176eda;
        pdVar59 = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             pdVar59[uVar63];
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             pdVar59[uVar63 + 1];
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             pdVar59[uVar63 + 2];
        local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[1] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar57);
        local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[2] =
             (double)((model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar57);
        local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = (double)&local_398;
        Vector3_t::operator=
                  ((model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar57,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                    *)&local_4e8);
        uVar68 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar57];
        if (uVar68 != 0) {
          local_278 = (undefined1  [8])
                      ((model->pA).
                       super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar57);
          auStack_270._0_8_ =
               (model->multdof3_U).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar57;
          auStack_270._8_8_ =
               (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar57;
          auStack_270._16_8_ =
               (model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl
               .super__Vector_impl_data._M_start + uVar57;
          SpatialVector_t::
          SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                    ((SpatialVector_t *)&local_4e8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)local_278);
          Math::SpatialTransform::applyTranspose
                    ((model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar57,(SpatialVector *)&local_4e8)
          ;
          pSVar69 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar71 = *(double *)
                    ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          *(double *)
           &pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
               (double)local_278 +
               *(double *)
                &pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          *(double *)
           ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
               (double)auStack_270._0_8_ + dVar71;
          pdVar59 = (double *)
                    ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar71 = pdVar59[1];
          pdVar1 = (double *)
                   ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          *pdVar1 = (double)auStack_270._8_8_ + *pdVar59;
          pdVar1[1] = (double)auStack_270._16_8_ + dVar71;
          pdVar59 = (double *)
                    ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar71 = pdVar59[1];
          pdVar1 = (double *)
                   ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          *pdVar1 = local_258[0] + *pdVar59;
          pdVar1[1] = local_258[1] + dVar71;
        }
      }
      else if (pJVar23[uVar57].mDoFCount == 1) {
        if (JVar15 == JointTypeCustom) {
LAB_00176eda:
          uVar16 = pJVar23[uVar57].custom_joint_index;
          uVar68 = (ulong)*(uint *)((model->mCustomJoints).
                                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar16] + 8);
          pdVar59 = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               0.0;
          local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               0.0;
          if (uVar68 != 0) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_398,uVar68
                       ,1);
            dVar71 = (double)((ulong)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[1] & 0xfffffffffffffffe);
            if (0 < (long)dVar71) {
              lVar62 = 0;
              do {
                pdVar1 = pdVar59 + (ulong)uVar63 + lVar62;
                dVar13 = pdVar1[1];
                pdVar2 = (double *)
                         ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0] + lVar62 * 8);
                *pdVar2 = *pdVar1;
                pdVar2[1] = dVar13;
                lVar62 = lVar62 + 2;
              } while (lVar62 < (long)dVar71);
            }
            if (dVar71 != local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[1]) {
              do {
                *(double *)
                 ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0] + (long)dVar71 * 8) = pdVar59[(ulong)uVar63 + (long)dVar71];
                dVar71 = (double)((long)dVar71 + 1);
              } while ((long)dVar71 <
                       (long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[1]);
            }
          }
          dVar71 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0];
          pCVar25 = (model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar16];
          pSVar69 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar57;
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[0] = 0.0;
          local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[1] = 0.0;
          if (local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
              != 0.0) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4e8,
                       (Index)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[1],1);
            uVar68 = (long)local_4e8.E.super_Matrix3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array[1] -
                     ((long)local_4e8.E.super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[1] >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)local_4e8.E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[1]) {
              lVar62 = 0;
              do {
                pdVar59 = (double *)((long)dVar71 + lVar62 * 8);
                dVar13 = pdVar59[1];
                pdVar1 = (((Matrix<double,_6,_6,_0,_6,_6> *)
                          local_4e8.E.super_Matrix3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[0])->
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                         m_data.array + lVar62;
                *pdVar1 = *pdVar59;
                pdVar1[1] = dVar13;
                lVar62 = lVar62 + 2;
              } while (lVar62 < (long)uVar68);
            }
            if ((long)uVar68 <
                (long)local_4e8.E.super_Matrix3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array[1]) {
              do {
                (((Matrix<double,_6,_6,_0,_6,_6> *)
                 local_4e8.E.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [0])->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                m_data.array[uVar68] = *(double *)((long)dVar71 + uVar68 * 8);
                uVar68 = uVar68 + 1;
              } while (local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[1] != (double)uVar68);
            }
          }
          dVar71 = local_4e8.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[0];
          if (0 < (long)local_4e8.E.super_Matrix3d.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[1]) {
            lVar62 = *(long *)(pCVar25 + 0x78);
            pdVar59 = (double *)(*(long *)(pCVar25 + 0x70) + 0x20);
            lVar64 = 0;
            do {
              (((Matrix<double,_6,_6,_0,_6,_6> *)
               local_4e8.E.super_Matrix3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [0])->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.m_data.
              array[lVar64] =
                   (((Matrix<double,_6,_6,_0,_6,_6> *)
                    local_4e8.E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0])->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).
                   m_storage.m_data.array[lVar64] -
                   (*(double *)
                     ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) *
                    pdVar59[1] +
                    *(double *)
                     ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) *
                    pdVar59[-1] +
                    *(double *)
                     ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                    pdVar59[-3] +
                   *(double *)
                    ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) *
                   *pdVar59 +
                   *(double *)
                    ((long)&(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) *
                   pdVar59[-2] +
                   *(double *)
                    &(pSVar69->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * pdVar59[-4]);
              lVar64 = lVar64 + 1;
              pdVar59 = pdVar59 + lVar62;
            } while (local_4e8.E.super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[1] != (double)lVar64);
          }
          pCVar65 = (CustomJoint *)
                    local_4e8.E.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[1];
          if (*(CustomJoint **)(pCVar25 + 0xc0) !=
              (CustomJoint *)
              local_4e8.E.super_Matrix3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
             ) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(pCVar25 + 0xb8),
                       (Index)local_4e8.E.super_Matrix3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[1],1);
            pCVar65 = *(CustomJoint **)(pCVar25 + 0xc0);
          }
          pdVar59 = ((DenseStorage<double,__1,__1,_1,_0> *)&pCVar25[0xb8].field_0x0)->m_data;
          uVar68 = (long)pCVar65 - ((long)pCVar65 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)pCVar65) {
            lVar62 = 0;
            do {
              pdVar1 = (((Matrix<double,_6,_6,_0,_6,_6> *)dVar71)->
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                       m_data.array + lVar62;
              dVar13 = pdVar1[1];
              pdVar2 = pdVar59 + lVar62;
              *pdVar2 = *pdVar1;
              pdVar2[1] = dVar13;
              lVar62 = lVar62 + 2;
            } while (lVar62 < (long)uVar68);
          }
          if ((long)uVar68 < (long)pCVar65) {
            do {
              pdVar59[uVar68] =
                   (((Matrix<double,_6,_6,_0,_6,_6> *)dVar71)->
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.m_data.
                   array[uVar68];
              uVar68 = uVar68 + 1;
            } while (pCVar65 != (CustomJoint *)uVar68);
          }
          free((void *)local_4e8.E.super_Matrix3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[0]);
          uVar68 = (ulong)(model->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar57];
          if (uVar68 != 0) {
            pSVar69 = (model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_278 = (undefined1  [8])(pSVar69 + uVar57);
            auStack_270._16_8_ =
                 (model->mCustomJoints).
                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16];
            auStack_270._0_8_ = auStack_270._16_8_ + 0x88;
            auStack_270._8_8_ = auStack_270._16_8_ + 0xa0;
            auStack_270._16_8_ = auStack_270._16_8_ + 0xb8;
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[0] =
                 *(double *)
                  &pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[1] =
                 *(double *)
                  ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            pdVar59 = (double *)
                      ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[2] = *pdVar59;
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[3] = pdVar59[1];
            pdVar59 = (double *)
                      ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[4] = *pdVar59;
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[5] = pdVar59[1];
            local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
                 1.0;
            Eigen::internal::
            generic_product_impl<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
            ::scaleAndAddTo<Eigen::Matrix<double,6,1,0,6,1>>
                      ((Matrix<double,_6,_1,_0,_6,_1> *)&local_4e8,
                       (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                        *)auStack_270,(Matrix<double,__1,_1,_0,__1,_1> *)auStack_270._16_8_,
                       (Scalar *)&local_158);
            Math::SpatialTransform::applyTranspose
                      ((model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar57,
                       (SpatialVector *)&local_4e8);
            pSVar69 = (model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar71 = *(double *)
                      ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            *(double *)
             &pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
                 (double)local_278 +
                 *(double *)
                  &pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            *(double *)
             ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
                 (double)auStack_270._0_8_ + dVar71;
            pdVar59 = (double *)
                      ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            dVar71 = pdVar59[1];
            pdVar1 = (double *)
                     ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            *pdVar1 = (double)auStack_270._8_8_ + *pdVar59;
            pdVar1[1] = (double)auStack_270._16_8_ + dVar71;
            pdVar59 = (double *)
                      ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            dVar71 = pdVar59[1];
            pdVar1 = (double *)
                     ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            *pdVar1 = local_258[0] + *pdVar59;
            pdVar1[1] = local_258[1] + dVar71;
          }
          free((void *)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0]);
        }
        else {
          pSVar69 = (model->S).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar59 = (double *)
                    ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          pdVar1 = (double *)
                   ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          pSVar58 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar2 = (double *)
                   ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          pdVar3 = (double *)
                   ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar71 = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[uVar63] -
                   (pdVar1[1] * pdVar3[1] + pdVar59[1] * pdVar2[1] +
                    *(double *)
                     ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                    *(double *)
                     ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                   *pdVar1 * *pdVar3 + *pdVar59 * *pdVar2 +
                   *(double *)
                    &pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                   *(double *)
                    &pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>);
          (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar57] = dVar71;
          uVar68 = (ulong)(model->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar57];
          if (uVar68 != 0) {
            pSVar58 = pSVar58 + uVar57;
            pSVar69 = (model->U).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar13 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[uVar57];
            auVar74._0_8_ =
                 *(double *)
                  &pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar71;
            auVar74._8_8_ =
                 *(double *)
                  ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) * dVar71
            ;
            auVar75._8_8_ = dVar13;
            auVar75._0_8_ = dVar13;
            auVar75 = divpd(auVar74,auVar75);
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[0] =
                 auVar75._0_8_ +
                 *(double *)
                  &(pSVar58->super_Matrix<double,_6,_1,_0,_6,_1>).
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[1] =
                 auVar75._8_8_ +
                 *(double *)
                  ((long)&(pSVar58->super_Matrix<double,_6,_1,_0,_6,_1>).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            pdVar59 = (double *)
                      ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            auVar76._0_8_ = *pdVar59 * dVar71;
            auVar76._8_8_ = pdVar59[1] * dVar71;
            auVar26._8_8_ = dVar13;
            auVar26._0_8_ = dVar13;
            auVar75 = divpd(auVar76,auVar26);
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[2] =
                 auVar75._0_8_ +
                 *(double *)
                  ((long)&(pSVar58->super_Matrix<double,_6,_1,_0,_6,_1>).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[3] =
                 auVar75._8_8_ +
                 *(double *)
                  ((long)&(pSVar58->super_Matrix<double,_6,_1,_0,_6,_1>).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
            pdVar59 = (double *)
                      ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            auVar73._0_8_ = dVar71 * *pdVar59;
            auVar73._8_8_ = dVar71 * pdVar59[1];
            auVar27._8_8_ = dVar13;
            auVar27._0_8_ = dVar13;
            auVar75 = divpd(auVar73,auVar27);
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[4] =
                 auVar75._0_8_ +
                 *(double *)
                  ((long)&(pSVar58->super_Matrix<double,_6,_1,_0,_6,_1>).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            local_4e8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array[5] =
                 auVar75._8_8_ +
                 *(double *)
                  ((long)&(pSVar58->super_Matrix<double,_6,_1,_0,_6,_1>).
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
            Math::SpatialTransform::applyTranspose
                      ((model->X_lambda).
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar57,
                       (SpatialVector *)&local_4e8);
            pSVar69 = (model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar71 = *(double *)
                      ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
            *(double *)
             &pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
                 (double)local_278 +
                 *(double *)
                  &pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
            *(double *)
             ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
                 (double)auStack_270._0_8_ + dVar71;
            pdVar59 = (double *)
                      ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            dVar71 = pdVar59[1];
            pdVar1 = (double *)
                     ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
            *pdVar1 = (double)auStack_270._8_8_ + *pdVar59;
            pdVar1[1] = (double)auStack_270._16_8_ + dVar71;
            pdVar59 = (double *)
                      ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            dVar71 = pdVar59[1];
            pdVar1 = (double *)
                     ((long)&pSVar69[uVar68].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
            *pdVar1 = local_258[0] + *pdVar59;
            pdVar1[1] = local_258[1] + dVar71;
          }
        }
      }
      else if (JVar15 == JointTypeCustom) goto LAB_00176eda;
      uVar57 = uVar57 - 1;
    } while ((int)uVar57 != 0);
    uVar57 = ((long)*local_568 -
              (long)(local_560->
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ).
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  }
  if (1 < uVar57) {
    uVar57 = 1;
    do {
      uVar63 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar57].q_index;
      uVar16 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar57];
      pSVar24 = (model->X_lambda).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar66 = pSVar24 + uVar57;
      pSVar67 = &local_4e8;
      for (lVar62 = 9; lVar62 != 0; lVar62 = lVar62 + -1) {
        (pSVar67->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = *(double *)&(pSVar66->E).super_Matrix3d;
        pSVar66 = (pointer)((long)pSVar66 + ((ulong)bVar70 * -2 + 1) * 8);
        pSVar67 = (SpatialTransform *)((long)pSVar67 + (ulong)bVar70 * -0x10 + 8);
      }
      local_4e8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[2] = *(double *)((long)&pSVar24[uVar57].r.super_Vector3d + 0x10);
      local_4e8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[0] =
           *(double *)
            &pSVar24[uVar57].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
      local_4e8.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[1] =
           *(double *)
            ((long)&pSVar24[uVar57].r.super_Vector3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
      Math::SpatialTransform::apply
                (&local_4e8,
                 (model->a).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar16);
      pSVar69 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar58 = (model->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      dVar71 = *(double *)
                ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      *(double *)
       &pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
           (double)local_278 +
           *(double *)
            &pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      *(double *)
       ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
           (double)auStack_270._0_8_ + dVar71;
      pdVar59 = (double *)
                ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar71 = pdVar59[1];
      pdVar1 = (double *)
               ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar1 = (double)auStack_270._8_8_ + *pdVar59;
      pdVar1[1] = (double)auStack_270._16_8_ + dVar71;
      pdVar59 = (double *)
                ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar71 = pdVar59[1];
      pdVar1 = (double *)
               ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar1 = local_258[0] + *pdVar59;
      pdVar1[1] = local_258[1] + dVar71;
      pJVar23 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      JVar15 = pJVar23[uVar57].mJointType;
      if (pJVar23[uVar57].mDoFCount == 3) {
        if (JVar15 == JointTypeCustom) goto LAB_0017755e;
        local_278 = (undefined1  [8])
                    ((model->multdof3_Dinv).
                     super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar57);
        auStack_270._0_8_ =
             (model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
             super__Vector_impl_data._M_start + uVar57;
        auStack_270._8_8_ =
             (model->multdof3_U).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar57;
        auStack_270._16_8_ =
             (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar57;
        Vector3_t::
        Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  ((Vector3_t *)&local_398,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)local_278);
        pdVar59 = (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        pdVar59[uVar63] =
             local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
        pdVar59[uVar63 + 1] =
             local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1];
        pdVar59[uVar63 + 2] =
             local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2];
        local_278 = (undefined1  [8])
                    ((model->a).
                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar57);
        auStack_270._0_8_ =
             (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar57;
        auStack_270._8_8_ = (CustomJoint *)&local_398;
        SpatialVector_t::operator=
                  ((SpatialVector_t *)local_278,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)local_278);
      }
      else if (pJVar23[uVar57].mDoFCount == 1) {
        if (JVar15 == JointTypeCustom) {
LAB_0017755e:
          uVar16 = pJVar23[uVar57].custom_joint_index;
          pCVar25 = (model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar16];
          uVar17 = *(uint *)(pCVar25 + 8);
          local_278 = (undefined1  [8])(pCVar25 + 0xa0);
          auStack_270._0_8_ = pCVar25 + 0xb8;
          auStack_270._8_8_ = pCVar25 + 0x88;
          auStack_270._16_8_ =
               (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar57;
          local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               0.0;
          local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               0.0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_398,
                     *(Index *)(pCVar25 + 0xa8),1);
          dVar71 = (((PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)local_278)->m_storage
                   ).m_data.array[1];
          if (local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
              != dVar71) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_398,
                       (Index)dVar71,1);
            dVar71 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array[1];
          }
          lhs = local_278;
          if (0 < (long)dVar71) {
            memset((void *)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0],0,(long)dVar71 << 3);
          }
          local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               1.0;
          Eigen::internal::
          generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,Eigen::DenseShape,Eigen::DenseShape,7>
          ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)&local_398,
                     (Matrix<double,__1,__1,_0,__1,__1> *)lhs,
                     (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                      *)auStack_270,(Scalar *)&local_158);
          if ((ulong)uVar17 != 0) {
            pdVar59 = (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            uVar68 = 0;
            do {
              pdVar59[uVar63 + (int)uVar68] =
                   *(double *)
                    ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0] + uVar68 * 8);
              uVar68 = uVar68 + 1;
            } while (uVar17 != uVar68);
          }
          local_278 = (undefined1  [8])
                      ((model->a).
                       super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                       super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar57);
          auStack_270._0_8_ =
               (model->mCustomJoints).
               super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16] + 0x70;
          auStack_270._8_8_ = &local_398;
          SpatialVector_t::operator=
                    ((SpatialVector_t *)local_278,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                      *)local_278);
          free((void *)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0]);
        }
        else {
          pSVar69 = (model->a).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar58 = (model->U).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar59 = (double *)
                    ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          pdVar1 = (double *)
                   ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          pdVar2 = (double *)
                   ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          pdVar3 = (double *)
                   ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar72 = ((model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar57] -
                   (pdVar2[1] * pdVar3[1] + pdVar59[1] * pdVar1[1] +
                    *(double *)
                     ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                    *(double *)
                     ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                   *pdVar2 * *pdVar3 + *pdVar59 * *pdVar1 +
                   *(double *)
                    &pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                   *(double *)
                    &pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>)) *
                   (1.0 / (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data[uVar57]);
          (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          [uVar63] = dVar72;
          pSVar58 = (model->S).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar13 = *(double *)
                    ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          dVar71 = *(double *)
                    ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          *(double *)
           &pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
               *(double *)
                &pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar72 +
               *(double *)
                &pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          *(double *)
           ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
               dVar13 * dVar72 + dVar71;
          pdVar59 = (double *)
                    ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar13 = pdVar59[1];
          pdVar1 = (double *)
                   ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar71 = pdVar1[1];
          pdVar2 = (double *)
                   ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          *pdVar2 = *pdVar59 * dVar72 + *pdVar1;
          pdVar2[1] = dVar13 * dVar72 + dVar71;
          pdVar59 = (double *)
                    ((long)&pSVar58[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar13 = pdVar59[1];
          pdVar1 = (double *)
                   ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar71 = pdVar1[1];
          pdVar2 = (double *)
                   ((long)&pSVar69[uVar57].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          *pdVar2 = dVar72 * *pdVar59 + *pdVar1;
          pdVar2[1] = dVar72 * dVar13 + dVar71;
        }
      }
      else if (JVar15 == JointTypeCustom) goto LAB_0017755e;
      uVar57 = (ulong)((int)uVar57 + 1);
      uVar68 = ((long)*local_568 -
                (long)(local_560->
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ).
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    } while (uVar57 <= uVar68 && uVar68 - uVar57 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI void CalcMInvTimesTau ( Model &model,
    const VectorNd &Q,
    const VectorNd &Tau,
    VectorNd &QDDot,
    bool update_kinematics) {

  LOG << "Q          = " << Q.transpose() << std::endl;
  LOG << "---" << std::endl;

  // Reset the velocity of the root body
  model.v[0].setZero();
  model.a[0].setZero();

  if (update_kinematics) {
    for (unsigned int i = 1; i < model.mBodies.size(); i++) {
      jcalc_X_lambda_S (model, model.mJointUpdateOrder[i], Q);

      model.v_J[i].setZero();
      model.v[i].setZero();
      model.c[i].setZero();
      model.pA[i].setZero();
      model.I[i].setSpatialMatrix (model.IA[i]);
    }
  }

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    model.pA[i].setZero();
  }

  // ClearLogOutput();

  if (update_kinematics) {
    // Compute Articulate Body Inertias
    for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
      unsigned int q_index = model.mJoints[i].q_index;

      if (model.mJoints[i].mDoFCount == 1
          && model.mJoints[i].mJointType != JointTypeCustom) {
        model.U[i] = model.IA[i] * model.S[i];
        model.d[i] = model.S[i].dot(model.U[i]);
        //      LOG << "u[" << i << "] = " << model.u[i] << std::endl;
        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i] - 
            model.U[i] * (model.U[i] / model.d[i]).transpose();

#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      } else if (model.mJoints[i].mDoFCount == 3
          && model.mJoints[i].mJointType != JointTypeCustom) {

        model.multdof3_U[i] = model.IA[i] * model.multdof3_S[i];

#ifdef RBDL_USE_CASADI_MATH
        model.multdof3_Dinv[i] = 
          (model.multdof3_S[i].transpose() * model.multdof3_U[i]).inverse();
#else
        model.multdof3_Dinv[i] = 
          (model.multdof3_S[i].transpose()*model.multdof3_U[i]).inverse().eval();
#endif
        //      LOG << "mCustomJoints[kI]->u[" << i << "] = "
        //<< model.mCustomJoints[kI]->u[i].transpose() << std::endl;

        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i]
            - ( model.multdof3_U[i]
                * model.multdof3_Dinv[i]
                * model.multdof3_U[i].transpose());

#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] +=
            model.X_lambda[i].toMatrixTranspose()
            * Ia * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() +=
            model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      } else if (model.mJoints[i].mJointType == JointTypeCustom) {
        unsigned int kI     = model.mJoints[i].custom_joint_index;
        unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
        model.mCustomJoints[kI]->U = model.IA[i] * model.mCustomJoints[kI]->S;

#ifdef RBDL_USE_CASADI_MATH
        model.mCustomJoints[kI]->Dinv=(model.mCustomJoints[kI]->S.transpose()
            * model.mCustomJoints[kI]->U
            ).inverse();
#else
        model.mCustomJoints[kI]->Dinv = (model.mCustomJoints[kI]->S.transpose()
            * model.mCustomJoints[kI]->U
            ).inverse().eval();
#endif
        //      LOG << "mCustomJoints[kI]->u[" << i << "] = "
        //<< model.mCustomJoints[kI]->u.transpose() << std::endl;
        unsigned int lambda = model.lambda[i];

        if (lambda != 0) {
          SpatialMatrix Ia = model.IA[i] 
            - ( model.mCustomJoints[kI]->U
                * model.mCustomJoints[kI]->Dinv
                * model.mCustomJoints[kI]->U.transpose());
#ifdef RBDL_USE_CASADI_MATH
          model.IA[lambda] += model.X_lambda[i].toMatrixTranspose()
            * Ia * model.X_lambda[i].toMatrix();
#else
          model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose()
            * Ia
            * model.X_lambda[i].toMatrix();
#endif
        }
      }
    }
  }

  // compute articulated bias forces
  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    unsigned int q_index = model.mJoints[i].q_index;

    if (model.mJoints[i].mDoFCount == 1
        && model.mJoints[i].mJointType != JointTypeCustom) {

      model.u[i] = Tau[q_index] - model.S[i].dot(model.pA[i]);
      // LOG << "u[" << i << "] = " << model.u[i] << std::endl;
      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        SpatialVector pa = model.pA[i] + model.U[i] * model.u[i] / model.d[i];

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    } else if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {

      Vector3d tau_temp ( Tau[q_index],
          Tau[q_index + 1],
          Tau[q_index + 2]);
      model.multdof3_u[i] = tau_temp 
        - model.multdof3_S[i].transpose()*model.pA[i];
      //      LOG << "multdof3_u[" << i << "] = "
      // << model.multdof3_u[i].transpose() << std::endl;
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        SpatialVector pa = model.pA[i]
          + model.multdof3_U[i]
          * model.multdof3_Dinv[i]
          * model.multdof3_u[i];

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() +=
          model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd tau_temp(Tau.block(q_index,0,dofI,1));

      model.mCustomJoints[kI]->u = 
        tau_temp - ( model.mCustomJoints[kI]->S.transpose()* model.pA[i]);
      //      LOG << "mCustomJoints[kI]->u"
      // << model.mCustomJoints[kI]->u.transpose() << std::endl;
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        SpatialVector pa = model.pA[i]
          + (   model.mCustomJoints[kI]->U
              * model.mCustomJoints[kI]->Dinv
              * model.mCustomJoints[kI]->u);

#ifdef RBDL_USE_CASADI_MATH
        model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#else
        model.pA[lambda].noalias() +=
          model.X_lambda[i].applyTranspose(pa);
#endif
        LOG << "pA[" << lambda << "] = "
          << model.pA[lambda].transpose() << std::endl;
      }
    }
  }

  //  ClearLogOutput();

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];
    SpatialTransform X_lambda = model.X_lambda[i];

    model.a[i] = X_lambda.apply(model.a[lambda]) + model.c[i];
    LOG << "a'[" << i << "] = " << model.a[i].transpose() << std::endl;

    if (model.mJoints[i].mDoFCount == 1
        && model.mJoints[i].mJointType != JointTypeCustom) {
      QDDot[q_index] = (1./model.d[i])*(model.u[i]-model.U[i].dot(model.a[i]));
      model.a[i]     = model.a[i] + model.S[i] * QDDot[q_index];
    } else if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = 
        model.multdof3_Dinv[i] * (model.multdof3_u[i]
            - model.multdof3_U[i].transpose()*model.a[i]);

      QDDot[q_index]      = qdd_temp[0];
      QDDot[q_index + 1]  = qdd_temp[1];
      QDDot[q_index + 2]  = qdd_temp[2];
      model.a[i]          = model.a[i] + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;

      VectorNd qdd_temp = model.mCustomJoints[kI]->Dinv
        * (  model.mCustomJoints[kI]->u 
            - model.mCustomJoints[kI]->U.transpose() * model.a[i]);

      for(unsigned z = 0; z < dofI; ++z){
        QDDot[q_index+z]      = qdd_temp[z];
      }

      model.a[i] =    model.a[i]
        + model.mCustomJoints[kI]->S * qdd_temp;
    }
  }

  LOG << "QDDot = " << QDDot.transpose() << std::endl;
}